

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3DecOrHexToI64(char *z,i64 *pOut)

{
  byte bVar1;
  int length;
  int local_30;
  int local_2c;
  int k;
  int i;
  u64 u;
  i64 *pOut_local;
  char *z_local;
  
  if ((*z == '0') && ((z[1] == 'x' || (z[1] == 'X')))) {
    _k = 0;
    for (local_2c = 2; z[local_2c] == '0'; local_2c = local_2c + 1) {
    }
    local_30 = local_2c;
    while ((""[(byte)z[local_30]] & 8) != 0) {
      bVar1 = sqlite3HexToInt((int)z[local_30]);
      _k = _k * 0x10 + (ulong)bVar1;
      local_30 = local_30 + 1;
    }
    *pOut = _k;
    z_local._4_4_ = 2;
    if (z[local_30] == '\0' && local_30 - local_2c < 0x11) {
      z_local._4_4_ = 0;
    }
  }
  else {
    length = sqlite3Strlen30(z);
    z_local._4_4_ = sqlite3Atoi64(z,pOut,length,'\x01');
  }
  return z_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3DecOrHexToI64(const char *z, i64 *pOut){
#ifndef SQLITE_OMIT_HEX_INTEGER
  if( z[0]=='0'
   && (z[1]=='x' || z[1]=='X')
  ){
    u64 u = 0;
    int i, k;
    for(i=2; z[i]=='0'; i++){}
    for(k=i; sqlite3Isxdigit(z[k]); k++){
      u = u*16 + sqlite3HexToInt(z[k]);
    }
    memcpy(pOut, &u, 8);
    return (z[k]==0 && k-i<=16) ? 0 : 2;
  }else
#endif /* SQLITE_OMIT_HEX_INTEGER */
  {
    return sqlite3Atoi64(z, pOut, sqlite3Strlen30(z), SQLITE_UTF8);
  }
}